

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

llama_tensor_weight * __thiscall
llama_model_loader::require_weight(llama_model_loader *this,char *name)

{
  runtime_error *this_00;
  undefined8 in_RSI;
  char *in_stack_00000010;
  llama_model_loader *in_stack_00000018;
  llama_tensor_weight *weight;
  string local_38 [32];
  llama_tensor_weight *local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  local_18 = get_weight(in_stack_00000018,in_stack_00000010);
  if (local_18 == (llama_tensor_weight *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    format_abi_cxx11_((char *)local_38,"%s: tensor \'%s\' not found","require_weight",local_10);
    std::runtime_error::runtime_error(this_00,local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_18;
}

Assistant:

const llama_model_loader::llama_tensor_weight & llama_model_loader::require_weight(const char * name) const {
    const llama_tensor_weight * weight = get_weight(name);
    if (!weight) {
        throw std::runtime_error(format("%s: tensor '%s' not found", __func__, name));
    }
    return *weight;
}